

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

char * CB::bufcache_label(label *ld,char *c)

{
  char *pcVar1;
  undefined8 *puVar2;
  cb_class *pcVar3;
  undefined8 uVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  
  *(long *)c = (long)(ld->costs)._end - (long)(ld->costs)._begin >> 4;
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    pcVar1 = c + lVar5 + 8;
    pcVar3 = (ld->costs)._begin;
    if ((ulong)((long)(ld->costs)._end - (long)pcVar3 >> 4) <= uVar6) break;
    puVar2 = (undefined8 *)((long)&pcVar3->cost + lVar5);
    uVar4 = puVar2[1];
    *(undefined8 *)pcVar1 = *puVar2;
    *(undefined8 *)(pcVar1 + 8) = uVar4;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
  }
  return pcVar1;
}

Assistant:

inline size_t size() const { return _end - _begin; }